

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.h
# Opt level: O0

void __thiscall
o3dgc::Arithmetic_Codec::ExpGolombEncode
          (Arithmetic_Codec *this,uint symbol,int k,Static_Bit_Model *bModel0,
          Adaptive_Bit_Model *bModel1)

{
  Adaptive_Bit_Model *bModel1_local;
  Static_Bit_Model *bModel0_local;
  int k_local;
  uint symbol_local;
  Arithmetic_Codec *this_local;
  
  bModel0_local._4_4_ = symbol;
  for (bModel0_local._0_4_ = k;
      (uint)(1 << ((byte)(int)bModel0_local & 0x1f)) <= bModel0_local._4_4_;
      bModel0_local._0_4_ = (int)bModel0_local + 1) {
    encode(this,1,bModel1);
    bModel0_local._4_4_ = bModel0_local._4_4_ - (1 << ((byte)(int)bModel0_local & 0x1f));
  }
  encode(this,0,bModel1);
  while ((int)bModel0_local != 0) {
    encode(this,(int)(short)((ushort)(bModel0_local._4_4_ >>
                                     ((byte)((int)bModel0_local + -1) & 0x1f)) & 1),bModel0);
    bModel0_local._0_4_ = (int)bModel0_local + -1;
  }
  return;
}

Assistant:

void     ExpGolombEncode(unsigned int symbol, 
                               int k,
                               Static_Bit_Model & bModel0,
                               Adaptive_Bit_Model & bModel1)
               {
                   while(1)
                   {
                       if (symbol >= (unsigned int)(1<<k))
                       {
                           encode(1, bModel1);
                           symbol = symbol - (1<<k);
                           k++;
                       }
                       else
                       {
                           encode(0, bModel1); // now terminated zero of unary part
                           while (k--) // next binary part
                           {
                               encode((signed short)((symbol>>k)&1), bModel0);
                           }
                           break;
                       }
                   }
               }